

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimSeq.c
# Opt level: O3

int Raig_ManSimulate(Aig_Man_t *pAig,int nWords,int nIters,int TimeLimit,int fMiter,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  Abc_Cex_t *pAVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  Raig_Man_t *p;
  double dVar9;
  timespec ts;
  int iPat;
  Sec_MtrStatus_t local_78;
  Raig_Man_t *local_58;
  int local_50;
  int local_4c;
  ulong local_48;
  double local_40;
  long local_38;
  
  local_50 = fMiter;
  iVar1 = clock_gettime(3,(timespec *)&local_78);
  if (iVar1 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = (long)local_78._8_8_ / 1000 + local_78._0_8_ * 1000000;
  }
  if (pAig->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigSimSeq.c"
                  ,0x1cc,"int Raig_ManSimulate(Aig_Man_t *, int, int, int, int, int)");
  }
  Sec_MiterStatus(&local_78,pAig);
  if (local_78.nSat < 1) {
    if (local_78.nUndec == 0) {
      puts("Miter is trivially unsatisfiable.");
      uVar3 = 0;
    }
    else {
      Aig_ManRandom(1);
      local_58 = Raig_ManCreate(pAig);
      local_58->nWords = nWords;
      local_48 = (ulong)(uint)nWords;
      if (nIters < 1) {
        iVar1 = 0;
      }
      else {
        local_40 = (double)lVar7;
        local_38 = (long)TimeLimit;
        iVar8 = 0;
        do {
          iVar1 = clock_gettime(3,(timespec *)&local_78);
          if (iVar1 < 0) {
            lVar6 = 1;
          }
          else {
            lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_78._8_8_),8);
            lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_78._0_8_ * -1000000;
          }
          iVar1 = Raig_ManSimulateRound(local_58,local_50,(uint)(iVar8 == 0),&local_4c);
          if (fVerbose != 0) {
            printf("Frame %4d out of %4d and timeout %3d sec. ",(ulong)(iVar8 + 1),
                   (ulong)(uint)nIters,(ulong)(uint)TimeLimit);
            iVar2 = clock_gettime(3,(timespec *)&local_78);
            dVar9 = -1.0;
            if (-1 < iVar2) {
              dVar9 = (double)((long)local_78._8_8_ / 1000 + local_78._0_8_ * 1000000);
            }
            printf("Time = %7.2f sec\r",(dVar9 - local_40) / 1000000.0);
          }
          p = local_58;
          if (0 < iVar1) {
            uVar3 = Raig_ManFindPo(local_58->pAig,iVar1);
            if (pAig->pSeqModel != (Abc_Cex_t *)0x0) {
              __assert_fail("pAig->pSeqModel == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigSimSeq.c"
                            ,0x1e8,"int Raig_ManSimulate(Aig_Man_t *, int, int, int, int, int)");
            }
            pAVar5 = Raig_ManGenerateCounter(pAig,iVar8,uVar3,(int)local_48,local_4c,p->vCis2Ids);
            pAig->pSeqModel = pAVar5;
            if (fVerbose == 0) goto LAB_0063ea6c;
            printf("Miter is satisfiable after simulation (output %d).\n",(ulong)uVar3);
            goto LAB_0063e9ae;
          }
          iVar2 = clock_gettime(3,(timespec *)&local_78);
          if (iVar2 < 0) {
            lVar4 = -1;
          }
          else {
            lVar4 = (long)local_78._8_8_ / 1000 + local_78._0_8_ * 1000000;
          }
          if (local_38 <= (lVar4 + lVar6) / 1000000) {
            printf("No bug detected after %d frames with time limit %d seconds.\n",
                   (ulong)(iVar8 + 1),(ulong)(uint)TimeLimit);
            break;
          }
          iVar8 = iVar8 + 1;
        } while (nIters != iVar8);
      }
      p = local_58;
      if (fVerbose != 0) {
LAB_0063e9ae:
        iVar8 = 0x921b4e;
        printf("Maxcut = %8d.  AigMem = %7.2f MB.  SimMem = %7.2f MB.  ",
               (double)(p->nObjs << 4) * 9.5367431640625e-07,
               (double)(((int)local_48 * 4 + 4) * p->nMemsMax) * 9.5367431640625e-07);
        Abc_Print(iVar8,"%s =","Total time");
        iVar2 = 3;
        iVar8 = clock_gettime(3,(timespec *)&local_78);
        if (iVar8 < 0) {
          lVar6 = -1;
        }
        else {
          lVar6 = (long)local_78._8_8_ / 1000 + local_78._0_8_ * 1000000;
        }
        Abc_Print(iVar2,"%9.2f sec\n",(double)(lVar6 - lVar7) / 1000000.0);
      }
LAB_0063ea6c:
      Raig_ManDelete(p);
      uVar3 = (uint)(0 < iVar1);
    }
  }
  else {
    printf("Miter is trivially satisfiable (output %d).\n",(ulong)(uint)local_78.iOut);
    uVar3 = 1;
  }
  return uVar3;
}

Assistant:

int Raig_ManSimulate( Aig_Man_t * pAig, int nWords, int nIters, int TimeLimit, int fMiter, int fVerbose )
{
    Raig_Man_t * p;
    Sec_MtrStatus_t Status;
    int i, iPat, RetValue = 0;
    abctime clk, clkTotal = Abc_Clock();
    assert( Aig_ManRegNum(pAig) > 0 );
    Status = Sec_MiterStatus( pAig );
    if ( Status.nSat > 0 )
    {
        printf( "Miter is trivially satisfiable (output %d).\n", Status.iOut );
        return 1;
    }
    if ( Status.nUndec == 0 )
    {
        printf( "Miter is trivially unsatisfiable.\n" );
        return 0;
    }
    Aig_ManRandom( 1 );
    p = Raig_ManCreate( pAig );
    p->nWords = nWords;
    // iterate through objects
    for ( i = 0; i < nIters; i++ )
    {
        clk = Abc_Clock();
        RetValue = Raig_ManSimulateRound( p, fMiter, i==0, &iPat );
        if ( fVerbose )
        {
            printf( "Frame %4d out of %4d and timeout %3d sec. ", i+1, nIters, TimeLimit );
            printf("Time = %7.2f sec\r", (1.0*Abc_Clock()-clkTotal)/CLOCKS_PER_SEC);
        }
        if ( RetValue > 0 )
        {
            int iOut = Raig_ManFindPo(p->pAig, RetValue);
            assert( pAig->pSeqModel == NULL );
            pAig->pSeqModel = Raig_ManGenerateCounter( pAig, i, iOut, nWords, iPat, p->vCis2Ids );
            if ( fVerbose )
            printf( "Miter is satisfiable after simulation (output %d).\n", iOut );
            break;
        }
        if ( (Abc_Clock() - clk)/CLOCKS_PER_SEC >= TimeLimit )
        {
            printf( "No bug detected after %d frames with time limit %d seconds.\n", i+1, TimeLimit );
            break;
        }
    }
    if ( fVerbose )
    {
        printf( "Maxcut = %8d.  AigMem = %7.2f MB.  SimMem = %7.2f MB.  ", 
            p->nMemsMax, 
            1.0*(p->nObjs * 16)/(1<<20), 
            1.0*(p->nMemsMax * 4 * (nWords+1))/(1<<20) );
        ABC_PRT( "Total time", Abc_Clock() - clkTotal );
    }
    Raig_ManDelete( p );
    return RetValue > 0;
}